

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O0

void __thiscall OpenMD::BondStamp::~BondStamp(BondStamp *this)

{
  BondStamp *in_RDI;
  
  ~BondStamp(in_RDI);
  operator_delete(in_RDI,0xe8);
  return;
}

Assistant:

BondStamp::~BondStamp() {}